

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O3

int induced_align(d_level *dlev,int pct)

{
  char cVar1;
  uint uVar2;
  d_flags dVar3;
  int iVar4;
  int iVar5;
  s_level *psVar6;
  
  cVar1 = dlev->dnum;
  psVar6 = sp_levchn;
  do {
    if (psVar6 == (s_level *)0x0) {
LAB_0018bf16:
      if ((((uint)dungeons[cVar1].flags & 0x70) == 0) ||
         (uVar2 = mt_random(), pct <= (int)(uVar2 % 100))) {
        uVar2 = mt_random();
        iVar4 = (uVar2 % 3) * 0x1000000 + -0x1000000;
        iVar5 = 4;
        if (iVar4 != 0x1000000) {
          iVar5 = (iVar4 >> 0x18) + 2;
        }
        return iVar5;
      }
      dVar3 = dungeons[dlev->dnum].flags;
LAB_0018bf55:
      return (uint)dVar3 >> 4 & 7;
    }
    if ((cVar1 == (psVar6->dlevel).dnum) && (dlev->dlevel == (psVar6->dlevel).dlevel)) {
      if (((uint)psVar6->flags & 0x70) != 0) {
        uVar2 = mt_random();
        if ((int)(uVar2 % 100) < pct) {
          dVar3 = psVar6->flags;
          goto LAB_0018bf55;
        }
        cVar1 = dlev->dnum;
      }
      goto LAB_0018bf16;
    }
    psVar6 = psVar6->next;
  } while( true );
}

Assistant:

int induced_align(const d_level *dlev, int pct)
{
	s_level	*lev = Is_special(dlev);
	aligntyp al;

	if (lev && lev->flags.align)
		if (rn2(100) < pct) return lev->flags.align;

	if (dungeons[dlev->dnum].flags.align)
		if (rn2(100) < pct) return dungeons[dlev->dnum].flags.align;

	al = rn2(3) - 1;
	return Align2amask(al);
}